

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_town(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *__s1;
  long lVar3;
  store *psVar4;
  char *pcVar5;
  store *new;
  town *town;
  level_map_conflict *map;
  wchar_t i;
  char *name;
  store *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  __s1 = parser_getstr(p,"name");
  for (town = (town *)maps; town != (town *)0x0; town = *(town **)(town + 1)) {
    for (map._4_4_ = 0; map._4_4_ < *(int *)((long)&town->ego + 4); map._4_4_ = map._4_4_ + 1) {
      lVar3 = *(long *)&town->num_stores + (long)map._4_4_ * 0x28;
      iVar1 = strcmp(__s1,*(char **)(lVar3 + 8));
      if (iVar1 == 0) {
        psVar4 = store_new(*(wchar_t *)((long)pvVar2 + 0x18));
        pcVar5 = string_make(*(char **)((long)pvVar2 + 0x20));
        psVar4->name = pcVar5;
        psVar4->next = *(store **)(lVar3 + 0x18);
        *(store **)(lVar3 + 0x18) = psVar4;
        *(int *)(lVar3 + 0x20) = *(int *)(lVar3 + 0x20) + 1;
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_town(struct parser *p) {
	struct store *s = parser_priv(p);
	const char *name = parser_getstr(p, "name");
	int i;
	struct level_map *map = maps;
	while (map) {
		for (i = 0; i < map->num_towns; i++) {
			struct town *town = &map->towns[i];
			if (streq(name, town->code)) {
				/* Add a new store ready to fill up with details */
				struct store *new = store_new(s->sidx);
				new->name = string_make(s->name);
				new->next = town->stores;
				town->stores = new;
				town->num_stores++;
			}
		}
		map = map->next;
	}
	return PARSE_ERROR_NONE;
}